

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkFramebuffer obj_00;
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)23>_> obj;
  VkImageView attachments [2];
  Environment env;
  Resources res;
  VkFramebufferCreateInfo local_1f8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_1b0;
  Move<vk::Handle<(vk::HandleType)23>_> local_198;
  VkImageView local_178;
  deUint64 local_170;
  Environment local_168;
  Resources local_130;
  
  local_168.vkp = context->m_platformInterface;
  local_168.vkd = Context::getDeviceInterface(context);
  local_168.device = Context::getDevice(context);
  local_168.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_168.programBinaries = context->m_progCollection;
  local_168.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_168.maxResourceConsumers = 1;
  Framebuffer::Resources::Resources(&local_130,&local_168,extraout_RDX);
  local_1f8.pAttachments = &local_178;
  local_178.m_internal =
       local_130.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_170 = local_130.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>
              .m_data.object.m_internal;
  local_1f8.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_1f8.pNext = (void *)0x0;
  local_1f8.flags = 0;
  local_1f8.renderPass.m_internal =
       local_130.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_1f8.attachmentCount = 2;
  local_1f8.width = 0x100;
  local_1f8.height = 0x100;
  local_1f8.layers = 1;
  ::vk::createFramebuffer
            (&local_198,local_168.vkd,local_168.device,&local_1f8,local_168.allocationCallbacks);
  local_1b8 = (undefined4)
              local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  uStack_1b4 = local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal.
               _4_4_;
  DStack_1b0.m_deviceIface._0_4_ =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_1b0.m_deviceIface._4_4_ =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface._4_4_;
  DStack_1b0.m_device =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_1b0.m_allocator =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  obj_00.m_internal._4_4_ =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._4_4_;
  obj_00.m_internal._0_4_ =
       (undefined4)local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_1b0,obj_00);
  }
  local_1f8._0_8_ = (void *)((long)&local_1f8 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1f8._0_8_,
             (long)local_1f8.pNext + local_1f8._0_8_);
  if ((void *)local_1f8._0_8_ != (void *)((long)&local_1f8 + 0x10U)) {
    operator_delete((void *)local_1f8._0_8_,CONCAT44(local_1f8._20_4_,local_1f8.flags) + 1);
  }
  Framebuffer::Resources::~Resources(&local_130);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}